

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

void __thiscall
gl4cts::CopyImage::FunctionalTest::FunctionalTest(FunctionalTest *this,Context *context)

{
  GLenum src_target;
  GLenum dst_target;
  GLenum src;
  GLenum dst;
  uint uVar1;
  bool bVar2;
  GLuint src_frmt_id;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  tcu::TestCase::TestCase
            ((TestCase *)this,context->m_testCtx,"functional",
             "Test verifies CopySubImageData copy data as requested");
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FunctionalTest_020ce7e8;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_rb_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::FunctionalTest::testCase,_std::allocator<gl4cts::CopyImage::FunctionalTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar4 = 0;
  do {
    uVar1 = (uint)lVar4;
    if ((uVar1 & 0xe) != 8 && 2 < uVar1 - 1) {
      src_target = (&s_valid_targets)[lVar4];
      uVar5 = 0;
      do {
        if (1 < (uint)uVar5 - 5 && ((3 < uVar5 && 1 < uVar1 - 5) && ((uint)uVar5 & 0xe) != 8)) {
          dst_target = (&s_valid_targets)[uVar5];
          lVar3 = 0;
          do {
            if (lVar3 != 0x3a || lVar4 != 0) {
              src = (&s_internal_formats)[lVar3];
              lVar6 = 0;
              do {
                dst = *(GLenum *)((long)&s_internal_formats + lVar6);
                bVar2 = Utils::areFormatsCompatible(src,dst);
                if (bVar2) {
                  prepareTestCases(this,dst,dst_target,src,src_target);
                }
                lVar6 = lVar6 + 4;
              } while (lVar6 != 0xf4);
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 0x3d);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != 0xb);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb);
  return;
}

Assistant:

FunctionalTest::FunctionalTest(deqp::Context& context)
	: TestCase(context, "functional", "Test verifies CopySubImageData copy data as requested")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_rb_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	for (GLuint src_tgt_id = 0; src_tgt_id < s_n_valid_targets; ++src_tgt_id)
	{
		const GLenum src_target = s_valid_targets[src_tgt_id];

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0
		if ((GL_TEXTURE_1D == src_target) || (GL_TEXTURE_1D_ARRAY == src_target) || (GL_TEXTURE_2D == src_target) ||
			(GL_TEXTURE_CUBE_MAP == src_target) || (GL_TEXTURE_CUBE_MAP_ARRAY == src_target))
		{
			continue;
		}
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0 */

		for (GLuint dst_tgt_id = 0; dst_tgt_id < s_n_valid_targets; ++dst_tgt_id)
		{
			const GLenum dst_target = s_valid_targets[dst_tgt_id];

#if COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0
			if ((GL_TEXTURE_1D == dst_target) || (GL_TEXTURE_1D_ARRAY == dst_target) || (GL_TEXTURE_2D == dst_target) ||
				(GL_TEXTURE_CUBE_MAP == dst_target) || (GL_TEXTURE_CUBE_MAP_ARRAY == dst_target))
			{
				continue;
			}
#endif /* COPY_IMAGE_FUNCTIONAL_TEST_ENABLE_ALL_TARGETS == 0 */

			/* Skip render buffer as destination */
			if (GL_RENDERBUFFER == dst_target)
			{
				continue;
			}

			/* Skip multisampled */
			if ((true == Utils::isTargetMultisampled(src_target)) || (true == Utils::isTargetMultisampled(dst_target)))
			{
				continue;
			}

			for (GLuint src_frmt_id = 0; src_frmt_id < s_n_internal_formats; ++src_frmt_id)
			{
				const GLenum src_format = s_internal_formats[src_frmt_id];

				if (src_format == GL_RGB9_E5 && src_target == GL_RENDERBUFFER)
				{
					continue;
				}

				for (GLuint dst_frmt_id = 0; dst_frmt_id < s_n_internal_formats; ++dst_frmt_id)
				{
					const GLenum dst_format = s_internal_formats[dst_frmt_id];

					/* Skip not compatible formats */
					if (false == Utils::areFormatsCompatible(src_format, dst_format))
					{
						continue;
					}

					prepareTestCases(dst_format, dst_target, src_format, src_target);
				}
			}
		}
	}
}